

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void proto2_unittest::TestMutualRecursionA::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *to_msg_00;
  ulong uVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg != to_msg) {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestMutualRecursionA_SubGroupR>);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) == 0) goto LAB_00c962e0;
    if ((uVar1 & 1) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00c96332;
      if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var4 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest::TestMutualRecursionB>
                            (arena,pMVar2);
        to_msg[3]._vptr_MessageLite = pp_Var4;
      }
      else {
        TestMutualRecursionB::MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00c9633c;
      to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar5 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestMutualRecursionA_SubGroup>(arena,pMVar2);
        to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar5;
      }
      else {
        TestMutualRecursionA_SubGroup::MergeImpl(to_msg_00,pMVar2);
      }
    }
LAB_00c962e0:
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar3 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar3 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
LAB_00c96332:
  MergeImpl((TestMutualRecursionA *)&stack0xffffffffffffffd0);
LAB_00c9633c:
  MergeImpl((TestMutualRecursionA *)&stack0xffffffffffffffd0);
}

Assistant:

void TestMutualRecursionA::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMutualRecursionA*>(&to_msg);
  auto& from = static_cast<const TestMutualRecursionA&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestMutualRecursionA)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_subgroupr()->MergeFrom(
      from._internal_subgroupr());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.bb_ != nullptr);
      if (_this->_impl_.bb_ == nullptr) {
        _this->_impl_.bb_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.bb_);
      } else {
        _this->_impl_.bb_->MergeFrom(*from._impl_.bb_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.subgroup_ != nullptr);
      if (_this->_impl_.subgroup_ == nullptr) {
        _this->_impl_.subgroup_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.subgroup_);
      } else {
        _this->_impl_.subgroup_->MergeFrom(*from._impl_.subgroup_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}